

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

void __thiscall wasm::RemoveUnusedBrs::visitThrow(RemoveUnusedBrs *this,Throw *curr)

{
  Name name;
  Name name_00;
  Builder wasm_00;
  char *parent;
  bool bVar1;
  size_type sVar2;
  reference ppEVar3;
  TryTable *pTVar4;
  size_t sVar5;
  Name *pNVar6;
  bool *pbVar7;
  size_t sVar8;
  Expression **ppEVar9;
  Break *pBVar10;
  PassOptions *options;
  Expression *expression;
  Expression *rep;
  Break *br;
  Break *br_1;
  Expression *value;
  Builder builder;
  Module *wasm;
  Name dest;
  Name tag;
  Index j;
  TryTable *tryy;
  undefined1 auStack_28 [4];
  int i;
  Name thrownTag;
  Throw *curr_local;
  RemoveUnusedBrs *this_local;
  
  _auStack_28 = (curr->tag).super_IString.str._M_len;
  thrownTag.super_IString.str._M_len = (size_t)(curr->tag).super_IString.str._M_str;
  thrownTag.super_IString.str._M_str = (char *)curr;
  sVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                    (&this->catchers);
  tryy._4_4_ = (int)sVar2;
  do {
    tryy._4_4_ = tryy._4_4_ + -1;
    if (tryy._4_4_ < 0) {
      return;
    }
    ppEVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                        (&this->catchers,(long)tryy._4_4_);
    pTVar4 = Expression::dynCast<wasm::TryTable>(*ppEVar3);
    if (pTVar4 == (TryTable *)0x0) {
      return;
    }
    for (tag.super_IString.str._M_str._4_4_ = 0;
        sVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                          (&(pTVar4->catchTags).
                            super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        tag.super_IString.str._M_str._4_4_ < sVar5;
        tag.super_IString.str._M_str._4_4_ = tag.super_IString.str._M_str._4_4_ + 1) {
      pNVar6 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&(pTVar4->catchTags).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                          (ulong)tag.super_IString.str._M_str._4_4_);
      dest.super_IString.str._M_str = (char *)(pNVar6->super_IString).str._M_len;
      bVar1 = IString::operator==((IString *)&dest.super_IString.str._M_str,(IString *)auStack_28);
      if ((bVar1) || (bVar1 = IString::isNull((IString *)&dest.super_IString.str._M_str), bVar1)) {
        pbVar7 = ArenaVectorBase<ArenaVector<bool>,_bool>::operator[]
                           (&(pTVar4->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>,
                            (ulong)tag.super_IString.str._M_str._4_4_);
        if ((*pbVar7 & 1U) != 0) {
          return;
        }
        pNVar6 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                           (&(pTVar4->catchDests).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                            (ulong)tag.super_IString.str._M_str._4_4_);
        sVar5 = (pNVar6->super_IString).str._M_len;
        dest.super_IString.str._M_len = (size_t)(pNVar6->super_IString).str._M_str;
        builder.wasm = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::
                       getModule(&(this->
                                  super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                                  .
                                  super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                                );
        Builder::Builder((Builder *)&value,builder.wasm);
        bVar1 = IString::isNull((IString *)&dest.super_IString.str._M_str);
        if (bVar1) {
          name.super_IString.str._M_str = (char *)dest.super_IString.str._M_len;
          name.super_IString.str._M_len = sVar5;
          pBVar10 = Builder::makeBreak((Builder *)&value,name,(Expression *)0x0,(Expression *)0x0);
          parent = thrownTag.super_IString.str._M_str;
          wasm_00 = builder;
          options = Pass::getPassOptions((Pass *)this);
          expression = getDroppedChildrenAndAppend
                                 ((Expression *)parent,wasm_00.wasm,options,(Expression *)pBVar10,
                                  IgnoreParentEffects);
          Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::replaceCurrent
                    (&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                      ).
                      super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                      .
                      super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                     ,expression);
          stopFlow(this);
          return;
        }
        br_1 = (Break *)0x0;
        sVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (thrownTag.super_IString.str._M_str + 0x20));
        if (sVar8 == 1) {
          ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                *)(thrownTag.super_IString.str._M_str + 0x20),0);
          br_1 = (Break *)*ppEVar9;
        }
        else {
          sVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )(thrownTag.super_IString.str._M_str + 0x20));
          if (1 < sVar8) {
            br_1 = (Break *)Builder::makeTupleMake<ArenaVector<wasm::Expression*>&>
                                      ((Builder *)&value,
                                       (ArenaVector<wasm::Expression_*> *)
                                       (thrownTag.super_IString.str._M_str + 0x20));
          }
        }
        name_00.super_IString.str._M_str = (char *)dest.super_IString.str._M_len;
        name_00.super_IString.str._M_len = sVar5;
        pBVar10 = Builder::makeBreak((Builder *)&value,name_00,(Expression *)br_1,(Expression *)0x0)
        ;
        Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::replaceCurrent
                  (&(this->
                    super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                    ).
                    super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                    .
                    super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                   ,(Expression *)pBVar10);
        return;
      }
    }
  } while( true );
}

Assistant:

void visitThrow(Throw* curr) {
    // If a throw will definitely be caught, and it is not a catch with a
    // reference, then it is just a branch (i.e. the code is using exceptions as
    // control flow). Turn it into a branch here so that the rest of the pass
    // can optimize it with all other branches.
    //
    // To do so, look at the closest try and see if it will catch us, and
    // proceed outwards if not.
    auto thrownTag = curr->tag;
    for (int i = catchers.size() - 1; i >= 0; i--) {
      auto* tryy = catchers[i]->dynCast<TryTable>();
      if (!tryy) {
        // We do not handle mixtures of Try and TryTable.
        return;
      }
      for (Index j = 0; j < tryy->catchTags.size(); j++) {
        auto tag = tryy->catchTags[j];
        // The tag must match, or be a catch_all.
        if (tag == thrownTag || tag.isNull()) {
          // This must not be a catch with exnref.
          if (!tryy->catchRefs[j]) {
            // Success! Create a break to replace the throw.
            auto dest = tryy->catchDests[j];
            auto& wasm = *getModule();
            Builder builder(wasm);
            if (!tag.isNull()) {
              // We are catching a specific tag, so values might be sent.
              Expression* value = nullptr;
              if (curr->operands.size() == 1) {
                value = curr->operands[0];
              } else if (curr->operands.size() > 1) {
                value = builder.makeTupleMake(curr->operands);
              }
              auto* br = builder.makeBreak(dest, value);
              replaceCurrent(br);
              return;
            }

            // catch_all: no values are sent. Drop the throw's children (while
            // ignoring parent effects: the parent is a throw, but we have
            // proven we can remove that effect).
            auto* br = builder.makeBreak(dest);
            auto* rep = getDroppedChildrenAndAppend(
              curr, wasm, getPassOptions(), br, DropMode::IgnoreParentEffects);
            replaceCurrent(rep);
            // We modified the code here and may have added a drop, etc., so
            // stop the flow (rather than re-scan it somehow). We leave
            // optimizing anything that flows out for later iterations.
            stopFlow();
          }

          // Return even if we did not optimize: we found our tag was caught.
          return;
        }
      }
    }
  }